

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

void icetInvokeSingleImageStrategy
               (IceTEnum strategy,IceTInt *compose_group,IceTInt group_size,IceTInt image_dest,
               IceTSparseImage input_image,IceTSparseImage *result_image,IceTSizeType *piece_offset)

{
  IceTSparseImage *result_image_local;
  IceTInt image_dest_local;
  IceTInt group_size_local;
  IceTInt *compose_group_local;
  IceTEnum strategy_local;
  IceTSparseImage input_image_local;
  
  switch(strategy) {
  case 0x7001:
    icetAutomaticCompose(compose_group,group_size,image_dest,input_image,result_image,piece_offset);
    break;
  case 0x7002:
    icetBswapCompose(compose_group,group_size,image_dest,input_image,result_image,piece_offset);
    break;
  case 0x7003:
    icetTreeCompose(compose_group,group_size,image_dest,input_image,result_image,piece_offset);
    break;
  case 0x7004:
    icetRadixkCompose(compose_group,group_size,image_dest,input_image,result_image,piece_offset);
    break;
  default:
    icetRaiseDiagnostic("Invalid single image strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,199);
  }
  icetStateCheckMemory();
  return;
}

Assistant:

void icetInvokeSingleImageStrategy(IceTEnum strategy,
                                   const IceTInt *compose_group,
                                   IceTInt group_size,
                                   IceTInt image_dest,
                                   IceTSparseImage input_image,
                                   IceTSparseImage *result_image,
                                   IceTSizeType *piece_offset)
{
    icetRaiseDebug1("Invoking single image strategy %s",
                    icetSingleImageStrategyNameFromEnum(strategy));

    switch(strategy) {
      case ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC:
          icetAutomaticCompose(compose_group,
                               group_size,
                               image_dest,
                               input_image,
                               result_image,
                               piece_offset);
          break;
      case ICET_SINGLE_IMAGE_STRATEGY_BSWAP:
          icetBswapCompose(compose_group,
                           group_size,
                           image_dest,
                           input_image,
                           result_image,
                           piece_offset);
          break;
      case ICET_SINGLE_IMAGE_STRATEGY_TREE:
          icetTreeCompose(compose_group,
                          group_size,
                          image_dest,
                          input_image,
                          result_image,
                          piece_offset);
          break;
      case ICET_SINGLE_IMAGE_STRATEGY_RADIXK:
          icetRadixkCompose(compose_group,
                            group_size,
                            image_dest,
                            input_image,
                            result_image,
                            piece_offset);
          break;
      default:
          icetRaiseError("Invalid single image strategy.", ICET_INVALID_ENUM);
          break;
    }

    icetStateCheckMemory();
}